

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

uint str_octal_to_uint(char *str)

{
  bool bVar1;
  uint val;
  int non_zero_digit;
  char *p;
  uint result;
  char *str_local;
  
  p._4_4_ = 0;
  bVar1 = false;
  _val = str;
  while( true ) {
    if (*_val == '\0') {
      return p._4_4_;
    }
    if ((*_val < '0') || ('7' < *_val)) break;
    if (*_val != '\0') {
      bVar1 = true;
    }
    if (bVar1) {
      p._4_4_ = *_val + -0x30 + p._4_4_ * 8;
    }
    _val = _val + 1;
  }
  return 0;
}

Assistant:

unsigned int str_octal_to_uint(const char *str) {
  unsigned int result = 0;
  const char *p = str;
  int non_zero_digit = 0;
  while (*p) {
    if (*p < '0' || *p > '7')
      return 0;
    if (*p != 0)
      non_zero_digit = 1;
    if (non_zero_digit != 0) {
      unsigned int val = *p - '0';
      result = result << 3;
      result += val;
    }
    ++p;
  }
  return result;
}